

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

char * google::protobuf::internal::TcParser::MpUnknownEnumFallback
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  uint uVar1;
  ulong uVar2;
  char *pcVar3;
  uint *puVar4;
  ParseContext *ctx_00;
  ushort *puVar5;
  
  uVar2 = (ulong)*ptr;
  if ((long)uVar2 < 0) {
    ctx_00 = (ParseContext *)((long)ptr[1] << 7 | 0x7f);
    if ((long)ctx_00 < 0) {
      pcVar3 = (char *)((long)ptr[2] << 0xe | 0x3fff);
      if ((long)pcVar3 < 0) {
        ctx_00 = (ParseContext *)((ulong)ctx_00 & ((long)ptr[3] << 0x15 | 0x1fffffU));
        if ((long)ctx_00 < 0) {
          pcVar3 = (char *)((ulong)pcVar3 & ((long)ptr[4] << 0x1c | 0xfffffffU));
          if ((long)pcVar3 < 0) {
            ctx_00 = (ParseContext *)((ulong)ctx_00 & ((long)ptr[5] << 0x23 | 0x7ffffffffU));
            if ((long)ctx_00 < 0) {
              pcVar3 = (char *)((ulong)pcVar3 & ((long)ptr[6] << 0x2a | 0x3ffffffffffU));
              if ((long)pcVar3 < 0) {
                ctx_00 = (ParseContext *)((ulong)ctx_00 & ((long)ptr[7] << 0x31 | 0x1ffffffffffffU))
                ;
                if ((long)ctx_00 < 0) {
                  pcVar3 = (char *)((ulong)pcVar3 & ((ulong)(byte)ptr[8] << 0x38 | 0xffffffffffffff)
                                   );
                  if ((long)pcVar3 < 0) {
                    puVar5 = (ushort *)(ptr + 10);
                    if ((ptr[9] != '\x01') && (ptr[9] < '\0')) {
                      pcVar3 = Error(msg,pcVar3,ctx_00,data,table,hasbits);
                      return pcVar3;
                    }
                  }
                  else {
                    puVar5 = (ushort *)(ptr + 9);
                  }
                }
                else {
                  puVar5 = (ushort *)(ptr + 8);
                }
              }
              else {
                puVar5 = (ushort *)(ptr + 7);
              }
            }
            else {
              puVar5 = (ushort *)(ptr + 6);
            }
          }
          else {
            puVar5 = (ushort *)(ptr + 5);
          }
        }
        else {
          puVar5 = (ushort *)(ptr + 4);
        }
      }
      else {
        puVar5 = (ushort *)(ptr + 3);
      }
      ctx_00 = (ParseContext *)((ulong)ctx_00 & (ulong)pcVar3);
    }
    else {
      puVar5 = (ushort *)(ptr + 2);
    }
    uVar2 = uVar2 & (ulong)ctx_00;
  }
  else {
    puVar5 = (ushort *)(ptr + 1);
  }
  AddUnknownEnum(msg,table,data.field_0._0_4_,(int32_t)uVar2);
  if ((ctx->super_EpsCopyInputStream).limit_end_ <= puVar5) {
    if ((ulong)table->has_bits_offset != 0) {
      puVar4 = RefAt<unsigned_int>(msg,(ulong)table->has_bits_offset);
      *puVar4 = *puVar4 | (uint)hasbits;
    }
    return (char *)puVar5;
  }
  uVar1 = (uint)table->fast_idx_mask & (uint)*puVar5;
  if ((uVar1 & 7) == 0) {
    uVar2 = (ulong)(uVar1 & 0xfffffff8);
    pcVar3 = (char *)(**(code **)(&table[1].has_bits_offset + uVar2))
                               (msg,puVar5,ctx,
                                (ulong)*puVar5 ^ *(ulong *)(&table[1].fast_idx_mask + uVar2 * 2),
                                table,hasbits);
    return pcVar3;
  }
  protobuf_assumption_failed
            ("(idx & 7) == 0",
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
             ,0x44d);
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::MpUnknownEnumFallback(
    PROTOBUF_TC_PARAM_DECL) {
  // Like FastUnknownEnumFallback, but with the Mp ABI.
  uint32_t tag = data.tag();
  uint64_t tmp;
  ptr = ParseVarint(ptr, &tmp);
  if (PROTOBUF_PREDICT_FALSE(ptr == nullptr)) {
    PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
  }
  AddUnknownEnum(msg, table, tag, static_cast<int32_t>(tmp));
  PROTOBUF_MUSTTAIL return ToTagDispatch(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}